

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void loope_(PDISASM pMyDisasm)

{
  Int64 *pIVar1;
  char cVar2;
  UInt8 UVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  int iVar10;
  char *pFormat;
  UInt64 UVar11;
  
  (pMyDisasm->Instruction).Category = 0x10006;
  (pMyDisasm->Instruction).BranchType = 3;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"loope",6);
  iVar10 = Security(2,pMyDisasm);
  if (iVar10 != 0) {
    UVar11 = (pMyDisasm->Reserved_).EIP_VA;
    cVar2 = *(char *)((pMyDisasm->Reserved_).EIP_ + 1);
    iVar10 = (pMyDisasm->Reserved_).NB_PREFIX;
    (pMyDisasm->Reserved_).RelativeAddress = 1;
    if ((pMyDisasm->Reserved_).OperandSize < 0x20) {
      if (UVar11 == 0) {
        UVar11 = (pMyDisasm->Reserved_).EIP_REAL;
      }
      UVar11 = (UInt64)((int)UVar11 + iVar10 + cVar2 + 2U & 0xffff);
      pFormat = "%.4X";
    }
    else {
      if (UVar11 == 0) {
        UVar11 = (pMyDisasm->Reserved_).EIP_REAL;
      }
      UVar11 = UVar11 + (long)cVar2 + (long)iVar10 + 2;
      pFormat = "%.8X";
      if (UVar11 >> 0x20 != 0) {
        pFormat = "%.16llX";
      }
    }
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand1).OpMnemonic,pFormat,UVar11);
    (pMyDisasm->Operand1).AccessMode = 1;
    (pMyDisasm->Operand1).OpSize = 8;
    (pMyDisasm->Operand1).OpType = 0x4040000;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 2;
    (pMyDisasm->Instruction).AddrValue = UVar11;
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 0x21;
    pIVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
    *(byte *)pIVar1 = (byte)*pIVar1 | 1;
    UVar3 = EFLAGS_TABLE[0x3d].SF_;
    UVar4 = EFLAGS_TABLE[0x3d].ZF_;
    UVar5 = EFLAGS_TABLE[0x3d].AF_;
    UVar6 = EFLAGS_TABLE[0x3d].PF_;
    UVar7 = EFLAGS_TABLE[0x3d].CF_;
    UVar8 = EFLAGS_TABLE[0x3d].TF_;
    UVar9 = EFLAGS_TABLE[0x3d].IF_;
    (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x3d].OF_;
    (pMyDisasm->Instruction).Flags.SF_ = UVar3;
    (pMyDisasm->Instruction).Flags.ZF_ = UVar4;
    (pMyDisasm->Instruction).Flags.AF_ = UVar5;
    (pMyDisasm->Instruction).Flags.PF_ = UVar6;
    (pMyDisasm->Instruction).Flags.CF_ = UVar7;
    (pMyDisasm->Instruction).Flags.TF_ = UVar8;
    (pMyDisasm->Instruction).Flags.IF_ = UVar9;
    UVar3 = EFLAGS_TABLE[0x3d].NT_;
    UVar4 = EFLAGS_TABLE[0x3d].RF_;
    UVar5 = EFLAGS_TABLE[0x3d].alignment;
    (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x3d].DF_;
    (pMyDisasm->Instruction).Flags.NT_ = UVar3;
    (pMyDisasm->Instruction).Flags.RF_ = UVar4;
    (pMyDisasm->Instruction).Flags.alignment = UVar5;
  }
  return;
}

Assistant:

void __bea_callspec__ loope_(PDISASM pMyDisasm)
{
    signed long MyNumber;
    UInt64 MyAddress;
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+CONTROL_TRANSFER;
    pMyDisasm->Instruction.BranchType = JE;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "loope");
    #endif
    if (!Security(2, pMyDisasm)) return;
    if (GV.OperandSize >= 32) {
        MyNumber = *((Int8*) (GV.EIP_+1));
        CalculateRelativeAddress(&MyAddress,(Int64) GV.NB_PREFIX+2+MyNumber, pMyDisasm);
        if (MyAddress >= W64LIT (0x100000000)) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand1.OpMnemonic, "%.16llX",(Int64) MyAddress);
            #endif
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand1.OpMnemonic, "%.8X",(Int64) MyAddress);
            #endif
        }
        pMyDisasm->Operand1.AccessMode = READ;
        pMyDisasm->Operand1.OpSize = 8;
        pMyDisasm->Operand1.OpType = CONSTANT_TYPE+RELATIVE_;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG1;
        pMyDisasm->Instruction.AddrValue = MyAddress;
        GV.EIP_+=2;
        FillFlags(pMyDisasm, 61);
    }
    else {
        MyNumber = *((Int8*) (GV.EIP_+1));
        CalculateRelativeAddress(&MyAddress,(Int64) GV.NB_PREFIX+2+MyNumber, pMyDisasm);
        MyAddress = MyAddress & 0xffff;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand1.OpMnemonic, "%.4X",(Int64) MyAddress);
        #endif
        pMyDisasm->Operand1.AccessMode = READ;
        pMyDisasm->Operand1.OpSize = 8;
        pMyDisasm->Operand1.OpType = CONSTANT_TYPE+RELATIVE_;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG1;
        pMyDisasm->Instruction.AddrValue = MyAddress;
        GV.EIP_+=2;
        FillFlags(pMyDisasm, 61);

    }
}